

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

void __thiscall
ot::commissioner::JoinerSession::SendJoinFinResponse
          (JoinerSession *this,Request *aJoinFinReq,bool aAccept)

{
  bool bVar1;
  Error *pEVar2;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  string local_3c0;
  anon_class_1_0_00000001 local_39a;
  v10 local_399;
  v10 *local_398;
  char *local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  allocator local_361;
  string local_360;
  ErrorCode local_33c;
  JoinerSession *local_338;
  anon_class_1_0_00000001 local_32a;
  v10 local_329;
  v10 *local_328;
  char *local_320;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  ErrorCode local_2cc;
  Error local_2c8;
  ErrorCode local_29c;
  Tlv local_298;
  Error local_278;
  undefined1 local_240 [8];
  Response joinFin;
  Error error;
  bool aAccept_local;
  Request *aJoinFinReq_local;
  JoinerSession *this_local;
  undefined1 local_168 [16];
  v10 *local_158;
  char *local_150;
  string *local_148;
  v10 *local_140;
  char *pcStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_bool> local_128
  ;
  undefined1 local_108 [16];
  v10 *local_f8;
  char *local_f0;
  void **local_e8;
  v10 *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  JoinerSession **local_80;
  undefined1 *local_78;
  JoinerSession **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  JoinerSession **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_bool> *local_38
  ;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_bool> *local_28
  ;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_bool> *local_10
  ;
  
  error.mMessage.field_2._M_local_buf[0xf] = aAccept;
  Error::Error((Error *)&joinFin.mEndpoint);
  coap::Message::Message((Message *)local_240,kAcknowledgment,kChanged);
  tlv::Tlv::Tlv(&local_298,kNetworkDiagChildTable,
                (error.mMessage.field_2._M_local_buf[0xf] & 1U) - 1 | 1,kMeshCoP);
  AppendTlv(&local_278,(Message *)local_240,&local_298);
  pEVar2 = Error::operator=((Error *)&joinFin.mEndpoint,&local_278);
  local_29c = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_29c);
  Error::~Error(&local_278);
  tlv::Tlv::~Tlv(&local_298);
  if (!bVar1) {
    coap::Message::SetSubType((Message *)local_240,kJoinFinResponse);
    coap::Coap::SendResponse(&local_2c8,&this->mCoap,aJoinFinReq,(Response *)local_240);
    pEVar2 = Error::operator=((Error *)&joinFin.mEndpoint,&local_2c8);
    local_2cc = kNone;
    bVar1 = commissioner::operator!=(pEVar2,&local_2cc);
    Error::~Error(&local_2c8);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f0,"joiner-session",&local_2f1);
      SendJoinFinResponse::anon_class_1_0_00000001::operator()(&local_32a);
      local_b8 = &local_328;
      local_c0 = &local_329;
      bVar3 = ::fmt::v10::operator()(local_c0);
      local_320 = (char *)bVar3.size_;
      local_328 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::check_format_string<void_*,_bool_&,_FMT_COMPILE_STRING,_0>();
      local_c8 = &local_318;
      local_d8 = local_328;
      pcStack_d0 = local_320;
      local_e0 = (v10 *)&local_338;
      local_e8 = (void **)((long)&error.mMessage.field_2 + 0xf);
      local_50 = &local_d8;
      local_f8 = local_328;
      local_f0 = local_320;
      local_338 = this;
      local_48 = local_f8;
      pcStack_40 = local_f0;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,bool>
                (&local_128,local_e0,local_e8,(bool *)local_328);
      local_30 = local_108;
      local_38 = &local_128;
      local_20 = 0x7e;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      fmt.size_ = 0x7e;
      fmt.data_ = local_f0;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_318,local_f8,fmt,args);
      Log(kInfo,&local_2f0,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    }
  }
  local_33c = kNone;
  bVar1 = commissioner::operator!=((Error *)&joinFin.mEndpoint,&local_33c);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_360,"joiner-session",&local_361);
    SendJoinFinResponse::anon_class_1_0_00000001::operator()(&local_39a);
    local_a8 = &local_398;
    local_b0 = &local_399;
    bVar3 = ::fmt::v10::operator()(local_b0);
    local_390 = (char *)bVar3.size_;
    local_398 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    this_00 = (v10 *)&joinFin.mEndpoint;
    Error::ToString_abi_cxx11_(&local_3c0,(Error *)this_00);
    local_130 = &local_388;
    local_140 = local_398;
    pcStack_138 = local_390;
    local_148 = &local_3c0;
    local_a0 = &local_140;
    local_158 = local_398;
    local_150 = local_390;
    local_98 = local_158;
    pcStack_90 = local_150;
    this_local = (JoinerSession *)
                 ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_148,this_00,local_130);
    local_78 = local_168;
    local_80 = &this_local;
    local_68 = 0xd;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_80;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = local_150;
    local_70 = local_80;
    local_60 = local_78;
    local_58 = local_80;
    ::fmt::v10::vformat_abi_cxx11_(&local_388,local_158,fmt_00,args_00);
    Log(kWarn,&local_360,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
  }
  coap::Message::~Message((Message *)local_240);
  Error::~Error((Error *)&joinFin.mEndpoint);
  return;
}

Assistant:

void JoinerSession::SendJoinFinResponse(const coap::Request &aJoinFinReq, bool aAccept)
{
    Error          error;
    coap::Response joinFin{coap::Type::kAcknowledgment, coap::Code::kChanged};
    SuccessOrExit(error = AppendTlv(joinFin, {tlv::Type::kState, aAccept ? tlv::kStateAccept : tlv::kStateReject}));

    joinFin.SetSubType(MessageSubType::kJoinFinResponse);
    SuccessOrExit(error = mCoap.SendResponse(aJoinFinReq, joinFin));

    LOG_INFO(LOG_REGION_JOINER_SESSION, "session(={}) sent JOIN_FIN.rsp: accepted={}", static_cast<void *>(this),
             aAccept);

#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
    LOG_INFO(LOG_REGION_THCI, "session(={}) sent JOIN_FIN.rsp: {}", static_cast<void *>(this),
             utils::Hex(joinFin.GetPayload()));
#endif

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_JOINER_SESSION, "session(={}) sent JOIN_FIN.rsp failed: %s", error.ToString());
    }
}